

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O3

double stat_loadavg_fifteen(void)

{
  double loadavg [3];
  double adStack_28 [2];
  double local_18;
  
  getloadavg(adStack_28,3);
  return local_18;
}

Assistant:

double stat_loadavg_fifteen ( void )
{
  double val;  
#ifdef HAVE_GETLOADAVG
  double loadavg[3];
  getloadavg(loadavg,3);
  val = loadavg[2];
  
#else    
  char *p;
  sensor_slurp proc_loadavg = { "/proc/loadavg" };
  p = update_file(&proc_loadavg);
  
  p = skip_token(p);
  p = skip_token(p);
  val = strtod( p, (char **)NULL);
#endif //end HAVE_GETLOADAVG
  return val;
}